

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3OpenMasterTable(Parse *p,int iDb)

{
  Vdbe *pVVar1;
  int in_ESI;
  long in_RDI;
  Vdbe *v;
  undefined4 in_stack_00000008;
  int in_stack_00000018;
  int in_stack_0000001c;
  Parse *in_stack_00000020;
  Parse *in_stack_ffffffffffffffe8;
  int in_stack_fffffffffffffff0;
  int p4;
  
  pVVar1 = sqlite3GetVdbe(in_stack_ffffffffffffffe8);
  p4 = (int)((ulong)pVVar1 >> 0x20);
  sqlite3TableLock(in_stack_00000020,in_stack_0000001c,in_stack_00000018,p._7_1_,
                   (char *)CONCAT44(iDb,in_stack_00000008));
  sqlite3VdbeAddOp4Int
            (v,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_ESI,in_stack_fffffffffffffff0,p4);
  if (*(int *)(in_RDI + 0x34) == 0) {
    *(undefined4 *)(in_RDI + 0x34) = 1;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3OpenMasterTable(Parse *p, int iDb){
  Vdbe *v = sqlite3GetVdbe(p);
  sqlite3TableLock(p, iDb, MASTER_ROOT, 1, MASTER_NAME);
  sqlite3VdbeAddOp4Int(v, OP_OpenWrite, 0, MASTER_ROOT, iDb, 5);
  if( p->nTab==0 ){
    p->nTab = 1;
  }
}